

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

int If_CutDsdBalanceEval(If_Man_t *p,If_Cut_t *pCut,Vec_Int_t *vAig)

{
  uint uVar1;
  float fVar2;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar9;
  ulong uVar10;
  int Area;
  int pTimes [15];
  uint local_6c;
  int local_68 [18];
  ulong uVar8;
  
  uVar5 = *(uint *)&pCut->field_0x1c | 0x2000;
  *(uint *)&pCut->field_0x1c = uVar5;
  if (vAig != (Vec_Int_t *)0x0) {
    vAig->nSize = 0;
    uVar5 = *(uint *)&pCut->field_0x1c;
  }
  if (uVar5 < 0x1000000) {
    uVar1 = pCut->iCutFunc;
    if ((int)uVar1 < 0) {
LAB_0042ea08:
      __assert_fail("pCut->iCutFunc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/if.h"
                    ,0x1b4,"int If_CutTruthLit(If_Cut_t *)");
    }
    uVar9 = p->vTtDsds[0]->pArray[uVar1 >> 1];
    if ((int)uVar9 < 0) goto LAB_0042e9e9;
    if (1 < uVar9) {
      __assert_fail("Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x91a,"int If_CutDsdBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
    if (vAig != (Vec_Int_t *)0x0) {
      Vec_IntPush(vAig,uVar9 ^ uVar1 & 1);
      uVar5 = *(uint *)&pCut->field_0x1c;
    }
    *(uint *)&pCut->field_0x1c = uVar5 & 0xfffff000;
    iVar6 = 0;
  }
  else if ((uVar5 & 0xff000000) == 0x1000000) {
    if (pCut->iCutFunc < 0) goto LAB_0042ea08;
    uVar1 = p->vTtDsds[1]->pArray[(uint)pCut->iCutFunc >> 1];
    if ((int)uVar1 < 0) goto LAB_0042e9e9;
    if ((uVar1 & 0x7ffffffe) != 2) {
      __assert_fail("Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x922,"int If_CutDsdBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
    if (vAig == (Vec_Int_t *)0x0) {
      *(uint *)&pCut->field_0x1c = uVar5 & 0x1fff000;
    }
    else {
      Vec_IntPush(vAig,0);
      uVar5 = pCut->iCutFunc;
      if ((int)uVar5 < 0) goto LAB_0042ea08;
      uVar1 = p->vTtDsds[(byte)pCut->field_0x1f]->pArray[uVar5 >> 1];
      if ((int)uVar1 < 0) goto LAB_0042e9e9;
      Vec_IntPush(vAig,(uVar1 ^ uVar5) & 1);
      uVar5 = *(uint *)&pCut->field_0x1c;
      *(uint *)&pCut->field_0x1c = uVar5 & 0xfffff000;
      if (uVar5 < 0x1000000) {
        __assert_fail("i >= 0 && i < (int)pCut->nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/if.h"
                      ,0x19b,"If_Obj_t *If_CutLeaf(If_Man_t *, If_Cut_t *, int)");
      }
    }
    fVar2 = pCut[1].Area;
    if (((long)(int)fVar2 < 0) || (p->vObjs->nSize <= (int)fVar2)) {
LAB_0042e9ca:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    iVar6 = (int)*(float *)((long)p->vObjs->pArray[(int)fVar2] + 0x5c);
  }
  else {
    local_6c = 0;
    uVar1 = pCut->iCutFunc;
    if ((int)uVar1 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar7 = uVar5 >> 0x18;
    uVar8 = (ulong)uVar7;
    uVar9 = 6;
    if (6 < uVar7) {
      uVar9 = uVar7;
    }
    uVar9 = uVar9 * (uVar1 >> 1);
    if (p->vTtPerms[uVar8]->nSize <= (int)uVar9) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                    ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
    }
    pcVar3 = p->vTtPerms[uVar8]->pArray;
    pVVar4 = p->vObjs;
    uVar10 = 0;
    do {
      fVar2 = (&pCut[1].Area)[uVar10];
      if (((long)(int)fVar2 < 0) || (pVVar4->nSize <= (int)fVar2)) goto LAB_0042e9ca;
      local_68[uVar10] = (int)*(float *)((long)pVVar4->pArray[(int)fVar2] + 0x5c);
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
    uVar7 = p->vTtDsds[uVar8]->pArray[uVar1 >> 1];
    if ((int)uVar7 < 0) {
LAB_0042e9e9:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    iVar6 = If_CutDsdBalanceEvalInt
                      (p->pIfDsdMan,uVar7 ^ (uVar5 >> 0xc ^ uVar1) & 1,local_68,vAig,
                       (int *)&local_6c,pcVar3 + uVar9);
    *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000 | local_6c & 0xfff;
  }
  return iVar6;
}

Assistant:

int If_CutDsdBalanceEval( If_Man_t * p, If_Cut_t * pCut, Vec_Int_t * vAig )
{
    int fUseCofs = 0;
    pCut->fUser = 1;
    if ( vAig )
        Vec_IntClear( vAig );
    if ( pCut->nLeaves == 0 ) // const
    {
        assert( Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutDsdLit(p, pCut)) );
        pCut->Cost = 0;
        return 0;
    }
    if ( pCut->nLeaves == 1 ) // variable
    {
        assert( Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 1 );
        if ( vAig )
            Vec_IntPush( vAig, 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutDsdLit(p, pCut)) );
        pCut->Cost = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        int fVerbose = 0;
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        int Delay, Area = 0;
        char * pPermLits = If_CutDsdPerm(p, pCut);
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay; 
        Delay = If_CutDsdBalanceEvalInt( p->pIfDsdMan, Abc_LitNotCond(If_CutDsdLit(p, pCut), pCut->fCompl), pTimes, vAig, &Area, If_CutDsdPerm(p, pCut) );
        pCut->Cost = Area;
        // try cofactoring 
        if ( fUseCofs )
        {
            // count how many times the max one appears
            int iMax = 0, nCountMax = 1;
            for ( i = 1; i < If_CutLeaveNum(pCut); i++ )
                if ( pTimes[i] > pTimes[iMax] )
                    iMax = i, nCountMax = 1;
                else if ( pTimes[i] == pTimes[iMax] )
                    nCountMax++;
            // decide when to try the decomposition
            if ( nCountMax == 1 && pTimes[iMax] + 2 < Delay && If_DsdManCheckNonTriv( p->pIfDsdMan, Abc_Lit2Var(If_CutDsdLit(p, pCut)), 
                 If_CutLeaveNum(pCut), If_CutDsdPermLitMax(pPermLits, If_CutLeaveNum(pCut), iMax)) )
            {
//                fVerbose = 1;
                Delay = pTimes[iMax] + 2;
            }
        }
        // report the result
        if ( fVerbose )
        {
/*
            int Max = 0, Two = 0;
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                Max = Abc_MaxInt( Max, pTimes[i] );
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                if ( pTimes[i] != Max )
                    Two = Abc_MaxInt( Two, pTimes[i] );
            if ( Two + 2 < Max && Max + 3 < Delay )
*/
            {
                for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                    printf( "%3d ", pTimes[Abc_Lit2Var(pPermLits[i])] );
                for ( ; i < p->pPars->nLutSize; i++ )
                    printf( "    " );
                printf( "-> %3d   ", Delay );
                If_DsdManPrintOne( stdout, p->pIfDsdMan, Abc_Lit2Var(If_CutDsdLit(p, pCut)), NULL, 0 );
                printf( "\n" );
            }
        }
        return Delay;
    }
}